

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

size_t __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::insert
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,size_t outerIndex,
          size_t innerIndex,double value)

{
  bool bVar1;
  size_t sVar2;
  double *pdVar3;
  reference pvVar4;
  size_type sVar5;
  value_type in_EDX;
  ulong in_RSI;
  VectorDynSize *in_RDI;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *in_XMM0_Qa;
  size_t nextOuterIndex;
  size_t i;
  size_t insertionIndex;
  size_t in_stack_ffffffffffffff78;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff98;
  double dVar6;
  undefined4 in_stack_ffffffffffffffa0;
  value_type vVar7;
  undefined4 in_stack_ffffffffffffffa4;
  size_t *in_stack_ffffffffffffffc0;
  ulong uVar8;
  size_t in_stack_ffffffffffffffc8;
  size_t index;
  size_t local_8;
  
  uVar8 = in_RDI[2].m_size;
  sVar2 = VectorDynSize::size(in_RDI);
  if (uVar8 <= sVar2) {
    VectorDynSize::size(in_RDI);
    reserve(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  local_8 = 0;
  bVar1 = valueIndexForOuterAndInnerIndices
                    (in_XMM0_Qa,0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (!bVar1) {
    VectorDynSize::size(in_RDI);
    VectorDynSize::resize(&in_stack_ffffffffffffff80->m_values,in_stack_ffffffffffffff78);
    std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 1));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    sVar2 = VectorDynSize::size(in_RDI);
    while (index = sVar2 - 1, local_8 < index && index != 0) {
      pdVar3 = VectorDynSize::operator()(in_RDI,sVar2 - 2);
      dVar6 = *pdVar3;
      pdVar3 = VectorDynSize::operator()(in_RDI,index);
      *pdVar3 = dVar6;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),index - 1);
      vVar7 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),index);
      *pvVar4 = vVar7;
      sVar2 = index;
    }
    pdVar3 = VectorDynSize::operator()(in_RDI,local_8);
    *pdVar3 = (double)in_XMM0_Qa;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),local_8);
    *pvVar4 = in_EDX;
    while (uVar8 = in_RSI,
          sVar5 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)&in_RDI[1].m_capacity),
          in_RSI < sVar5 - 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RDI[1].m_capacity,uVar8 + 1);
      *pvVar4 = *pvVar4 + 1;
      in_RSI = uVar8 + 1;
    }
  }
  return local_8;
}

Assistant:

std::size_t SparseMatrix<ordering>::insert(std::size_t outerIndex, std::size_t innerIndex, double value)
    {
        //first: check if there is space in the arrays
        if (m_allocatedSize <= m_values.size()) {
            reserve(m_values.size() + 10);
        }

        //find insertion position
        std::size_t insertionIndex = 0;
        if (valueIndexForOuterAndInnerIndices(outerIndex, innerIndex, insertionIndex)) {
            //???: what if the element exists alredy in the matrix?
            return insertionIndex;
        }

        //I found the index. Now I have to shift to the right the values and inner elements
        m_values.resize(m_values.size() + 1);
        m_innerIndices.resize(m_innerIndices.size() + 1);

        for (std::size_t i = m_values.size() - 1; i > insertionIndex && i > 0; --i) {
            m_values(i) = m_values(i - 1);
            m_innerIndices[i] = m_innerIndices[i - 1];
        }

        m_values(insertionIndex) = value;
        m_innerIndices[insertionIndex] = innerIndex;
        //update row NNZ
        for (std::size_t nextOuterIndex = outerIndex; nextOuterIndex < m_outerStarts.size() - 1; ++nextOuterIndex) {
            m_outerStarts[nextOuterIndex + 1]++;
        }

        return insertionIndex;
    }